

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::SetTestOutputTruncation(cmCTestTestHandler *this,string *mode)

{
  int iVar1;
  TruncationMode TVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)mode);
  if (iVar1 == 0) {
    TVar2 = Tail;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)mode);
    if (iVar1 == 0) {
      TVar2 = Middle;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)mode);
      if (iVar1 != 0) {
        return false;
      }
      TVar2 = Head;
    }
  }
  this->TestOutputTruncation = TVar2;
  return true;
}

Assistant:

bool cmCTestTestHandler::SetTestOutputTruncation(const std::string& mode)
{
  if (mode == "tail") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Tail;
  } else if (mode == "middle") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Middle;
  } else if (mode == "head") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Head;
  } else {
    return false;
  }
  return true;
}